

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

bool __thiscall GameEngine::isPopulationExist(GameEngine *this,size_t posX,size_t posY)

{
  undefined1 local_18 [16];
  
  Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,posY);
  CellType::getCurrentPopulation((CellType *)local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18 + 8));
  return local_18._0_8_ != 0;
}

Assistant:

bool GameEngine::isPopulationExist(size_t posX, size_t posY) {
  return (*map)[posY][posX]->getCurrentPopulation() != nullptr;
}